

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O1

bool __thiscall
graph_impl::
Graph<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>,_graph_meta::list<>,_graph_meta::list<>_>
::AddEdge(Graph<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>,_graph_meta::list<>,_graph_meta::list<>_>
          *this,EdgeType *edge)

{
  PointOnMap *__v;
  _Rb_tree<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>,graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>,std::_Identity<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>,std::less<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>,std::allocator<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>>
  *p_Var1;
  pair<std::_Rb_tree_iterator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_bool>
  pVar2;
  Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_> local_58;
  
  std::
  _Rb_tree<graph_tests::PointOnMap,graph_tests::PointOnMap,std::_Identity<graph_tests::PointOnMap>,std::less<graph_tests::PointOnMap>,std::allocator<graph_tests::PointOnMap>>
  ::_M_insert_unique<graph_tests::PointOnMap_const&>
            ((_Rb_tree<graph_tests::PointOnMap,graph_tests::PointOnMap,std::_Identity<graph_tests::PointOnMap>,std::less<graph_tests::PointOnMap>,std::allocator<graph_tests::PointOnMap>>
              *)&this->nodes_,&edge->from);
  __v = &edge->to;
  std::
  _Rb_tree<graph_tests::PointOnMap,graph_tests::PointOnMap,std::_Identity<graph_tests::PointOnMap>,std::less<graph_tests::PointOnMap>,std::allocator<graph_tests::PointOnMap>>
  ::_M_insert_unique<graph_tests::PointOnMap_const&>
            ((_Rb_tree<graph_tests::PointOnMap,graph_tests::PointOnMap,std::_Identity<graph_tests::PointOnMap>,std::less<graph_tests::PointOnMap>,std::allocator<graph_tests::PointOnMap>>
              *)&this->nodes_,__v);
  p_Var1 = (_Rb_tree<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>,graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>,std::_Identity<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>,std::less<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>,std::allocator<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>>
            *)std::
              map<graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>,_std::less<graph_tests::PointOnMap>,_std::allocator<std::pair<const_graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>_>_>_>
              ::operator[](&this->edges_,&edge->from);
  pVar2 = std::
          _Rb_tree<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>,graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>,std::_Identity<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>,std::less<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>,std::allocator<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>>
          ::
          _M_insert_unique<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>const&>
                    (p_Var1,edge);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    p_Var1 = (_Rb_tree<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>,graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>,std::_Identity<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>,std::less<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>,std::allocator<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>>
              *)std::
                map<graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>,_std::less<graph_tests::PointOnMap>,_std::allocator<std::pair<const_graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>_>_>_>
                ::operator[](&this->edges_,__v);
    std::
    _Rb_tree<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>,graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>,std::_Identity<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>,std::less<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>,std::allocator<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>>
    ::
    _M_insert_unique<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>const&>
              (p_Var1,edge);
    p_Var1 = (_Rb_tree<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>,graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>,std::_Identity<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>,std::less<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>,std::allocator<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>>
              *)std::
                map<graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>,_std::less<graph_tests::PointOnMap>,_std::allocator<std::pair<const_graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>_>_>_>
                ::operator[](&this->edges_,&edge->from);
    local_58.from.type = (edge->to).type;
    local_58.from._17_7_ = *(undefined7 *)&(edge->to).field_0x11;
    local_58.from.i = __v->i;
    local_58.from.j = (edge->to).j;
    local_58.to.i = (edge->from).i;
    local_58.to.j = (edge->from).j;
    local_58.to.type = (edge->from).type;
    local_58.to._17_7_ = *(undefined7 *)&(edge->from).field_0x11;
    std::
    _Rb_tree<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>,graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>,std::_Identity<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>,std::less<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>,std::allocator<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>>
    ::
    _M_insert_unique<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>
              (p_Var1,&local_58);
    p_Var1 = (_Rb_tree<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>,graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>,std::_Identity<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>,std::less<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>,std::allocator<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>>
              *)std::
                map<graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>,_std::less<graph_tests::PointOnMap>,_std::allocator<std::pair<const_graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>_>_>_>
                ::operator[](&this->edges_,__v);
    local_58.from.type = (edge->to).type;
    local_58.from._17_7_ = *(undefined7 *)&(edge->to).field_0x11;
    local_58.from.i = __v->i;
    local_58.from.j = (edge->to).j;
    local_58.to.i = (edge->from).i;
    local_58.to.j = (edge->from).j;
    local_58.to.type = (edge->from).type;
    local_58.to._17_7_ = *(undefined7 *)&(edge->from).field_0x11;
    std::
    _Rb_tree<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>,graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>,std::_Identity<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>,std::less<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>,std::allocator<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>>
    ::
    _M_insert_unique<graph_impl::Edge<graph_tests::PointOnMap,graph_meta::list<>,graph_meta::list<>>>
              (p_Var1,&local_58);
  }
  return (bool)(pVar2.second & 1);
}

Assistant:

bool AddEdge(const EdgeType& edge) {
    // TODO: clean up this mess
    AddNode(edge.from);
    AddNode(edge.to);
    if constexpr (graph_meta::contains_type_v<
                      graph::Multigraph, GraphTraits...>) {
      edges_[edge.from].insert(edge);
      edges_[edge.to].insert(edge);
      if constexpr (!graph_meta::contains_type_v<
                        graph::Directed, GraphTraits...>) {
        edges_[edge.from].insert(edge.ReversedCopy());
        edges_[edge.to].insert(edge.ReversedCopy());
      }
      return true;
    } else {
      bool res = edges_[edge.from].insert(edge).second;
      if (!res) return res;
      res |= edges_[edge.to].insert(edge).second;
      if constexpr (!graph_meta::contains_type_v<
                        graph::Directed, GraphTraits...>) {
        res |= edges_[edge.from].insert(edge.ReversedCopy()).second;
        res |= edges_[edge.to].insert(edge.ReversedCopy()).second;
      }
      return res;
    }
  }